

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.hh
# Opt level: O0

ostream * std::operator<<(ostream *os,vector<bool,_std::allocator<bool>_> *v)

{
  const_reference cVar1;
  size_type sVar2;
  ulong local_20;
  size_t i;
  vector<bool,_std::allocator<bool>_> *v_local;
  ostream *os_local;
  
  std::operator<<(os,"[");
  local_20 = 0;
  while( true ) {
    sVar2 = vector<bool,_std::allocator<bool>_>::size(v);
    if (sVar2 <= local_20) break;
    cVar1 = vector<bool,_std::allocator<bool>_>::operator[](v,local_20);
    std::ostream::operator<<(os,cVar1);
    sVar2 = vector<bool,_std::allocator<bool>_>::size(v);
    if (local_20 != sVar2 - 1) {
      std::operator<<(os,", ");
    }
    local_20 = local_20 + 1;
  }
  std::operator<<(os,"]");
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const std::vector<T> &v) {
  os << "[";
  for (size_t i = 0; i < v.size(); i++) {
    os << v[i];
    if (i != (v.size() - 1)) {
      os << ", ";
    }
  }
  os << "]";
  return os;
}